

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

t_symbol * get_object_type(t_object *obj)

{
  _binbuf *b;
  t_symbol *ptVar1;
  char *s_00;
  t_symbol *s;
  t_symbol *local_18;
  
  local_18 = (t_symbol *)0x0;
  if (obj == (t_object *)0x0) {
    return (t_symbol *)0x0;
  }
  switch(obj->field_0x2e & 3) {
  case 0:
    s_00 = "text";
    break;
  case 1:
    s_00 = "obj";
    break;
  case 2:
    s_00 = "msg";
    break;
  case 3:
    b = binbuf_new();
    gobj_save(&obj->te_g,b);
    binbuf_getpos(b,(int *)0x0,(int *)0x0,&local_18);
    binbuf_free(b);
    return local_18;
  }
  ptVar1 = gensym(s_00);
  return ptVar1;
}

Assistant:

static t_symbol*get_object_type(t_object *obj)
{
    t_symbol *s=0;
    t_binbuf *bb=0;
    if(!obj)
        return 0;
    switch(obj->te_type) {
    case T_OBJECT:
        return gensym("obj");
    case T_MESSAGE:
        return gensym("msg");
    case T_TEXT:
        return gensym("text");
    default:
            /* detecting the type of a gatom by using it's save function */
        bb=binbuf_new();
        gobj_save(&obj->te_g, bb);
        binbuf_getpos(bb, 0, 0, &s);
        binbuf_free(bb);
        return s;
    }
    return 0;
}